

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_source_content_sb(AV1_COMP *cpi,MACROBLOCK *x,TileDataEnc *tile_data,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  int16_t iVar5;
  int16_t iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  AV1_COMMON *cm_00;
  AV1_COMP *cpi_00;
  int in_ECX;
  TileInfo *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int j;
  int i;
  int last_src_stride;
  uint8_t *last_src;
  int src_stride;
  uint8_t *src;
  int plane;
  uint8_t w;
  uint8_t h;
  int shift_y [2];
  int shift_x [2];
  int is_this_blk_low_motion;
  int is_neighbor_blocks_low_motion;
  TileInfo *tile_info;
  MB_MODE_INFO **mi;
  uint threshold;
  int avg_q_step;
  PRIMARY_RATE_CONTROL *p_rc;
  int ac_q_step;
  uint nmean2;
  AV1_COMMON *cm;
  uint64_t sum_sq_thresh;
  uint64_t avg_source_sse_threshold_high;
  uint64_t avg_source_sse_threshold_low [2];
  uint64_t avg_source_sse_threshold_verylow;
  int last_src_offset;
  int last_src_ystride;
  uint8_t *last_src_y;
  int src_offset;
  int src_ystride;
  uint8_t *src_y;
  BLOCK_SIZE bsize;
  uint tmp_variance;
  uint tmp_sse;
  aom_bit_depth_t in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  uint local_f0;
  int local_ec;
  int local_e8;
  long local_e0;
  long local_d0;
  int local_c8;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ulong local_70;
  uint local_24;
  int local_20;
  int local_1c;
  TileInfo *local_18;
  long local_10;
  long *local_8;
  
  if (((*(int *)in_RDI[0x84f6] == *(int *)in_RDI[0x84f5]) &&
      (*(int *)(in_RDI[0x84f6] + 8) == *(int *)(in_RDI[0x84f5] + 8))) &&
     ((*(uint *)(*(long *)(in_RSI + 0x20b8) + 0xc0) & 8) == 0)) {
    bVar1 = *(byte *)(in_RDI[0x8401] + 0x1c);
    uVar8 = 10000;
    uVar7 = 100000;
    local_70 = 1000000;
    if (*(int *)((long)in_RDI + 0x60d64) != 0) {
      local_70 = 2000000;
      uVar7 = 200000;
      uVar8 = 20000;
    }
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    uVar9 = (**(code **)(*in_RDI + (ulong)bVar1 * 0x70 + 0xc918))
                      (*(long *)(in_RDI[0x84f5] + 0x28) +
                       (long)(*(int *)(in_RDI[0x84f5] + 0x20) * in_ECX * 4 + in_R8D * 4),
                       *(int *)(in_RDI[0x84f5] + 0x20),
                       *(long *)(in_RDI[0x84f6] + 0x28) +
                       (long)(*(int *)(in_RDI[0x84f6] + 0x20) * in_ECX * 4 + in_R8D * 4),
                       *(int *)(in_RDI[0x84f6] + 0x20),&local_24);
    plVar4 = local_8;
    if (local_24 < 36000) {
      *(undefined4 *)(local_10 + 0x15d64) = 2;
    }
    if (local_24 == 0) {
      *(undefined4 *)(local_10 + 0x15d60) = 0;
    }
    else {
      if (local_24 < uVar8) {
        *(undefined4 *)(local_10 + 0x15d60) = 1;
      }
      else if (local_24 < uVar7) {
        *(undefined4 *)(local_10 + 0x15d60) = 2;
      }
      else if (local_70 < local_24) {
        *(undefined4 *)(local_10 + 0x15d60) = 4;
      }
      if ((uVar9 < local_24 >> 1) && (10000 < local_24 - uVar9)) {
        *(undefined4 *)(local_10 + 0x15d68) = 1;
      }
      if (local_24 - uVar9 < 5000) {
        *(undefined4 *)(local_10 + 0x15d6c) = 1;
      }
      if (((local_70 * 7 >> 3 < (ulong)local_24) && (*(int *)(local_10 + 0x15d68) == 0)) &&
         (*(int *)(local_10 + 0x15d6c) == 0)) {
        *(undefined4 *)(local_10 + 0x2565c) = 0;
      }
      if (((((int)local_8[0xc1b3] != 0) && ((int)local_8[0xc0f6] == 0)) &&
          ((ulong)local_8[0xc0f9] < 0x4e21)) && ((int)local_8[0x13a67] < 2)) {
        cm_00 = (AV1_COMMON *)(local_8 + 0x77f0);
        iVar5 = av1_ac_quant_QTX(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                 in_stack_fffffffffffffee8);
        iVar10 = (int)*local_8 + 0x8b30;
        iVar6 = av1_ac_quant_QTX(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                 in_stack_fffffffffffffee8);
        if ((int)local_8[0xc1b3] == 1) {
          iVar11 = clamp((int)iVar6,0xfa,1000);
          local_f0 = iVar11 * iVar5;
        }
        else {
          local_f0 = iVar5 * 0xfa;
        }
        if ((uVar9 <= local_f0) && (local_24 - uVar9 < 0x10)) {
          lVar3 = plVar4[0x7837];
          iVar11 = get_mi_grid_idx((CommonModeInfoParams *)(plVar4 + 0x7831),local_1c,local_20);
          cpi_00 = (AV1_COMP *)(lVar3 + (long)iVar11 * 8);
          iVar11 = check_neighbor_blocks
                             ((MB_MODE_INFO **)cpi_00,*(int *)((long)plVar4 + 0x3c1c4),local_18,
                              local_1c,local_20);
          if ((iVar11 != 0) &&
             (iVar10 = fast_detect_non_zero_motion
                                 (cpi_00,(uint8_t *)local_18,iVar11,
                                  (uint8_t *)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                  in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,iVar10),
             iVar10 != 0)) {
            bVar2 = block_size_high[bVar1];
            bVar1 = block_size_wide[bVar1];
            for (local_c8 = 0; iVar10 = av1_num_planes(cm_00), local_c8 < iVar10;
                local_c8 = local_c8 + 1) {
              iVar10 = *(int *)(local_8[0x84f5] + 0x20 + (long)(int)(uint)(local_c8 != 0) * 4);
              iVar11 = *(int *)(local_8[0x84f6] + 0x20 + (long)(int)(uint)(local_c8 != 0) * 4);
              local_d0 = *(long *)(local_8[0x84f5] + 0x28 + (long)local_c8 * 8) +
                         (long)(iVar10 * (local_1c <<
                                         (2U - (char)*(undefined4 *)
                                                      (&stack0xffffffffffffff40 +
                                                      (long)(int)(uint)(local_c8 != 0) * 4) & 0x1f))
                               + (local_20 <<
                                 (2U - (char)*(undefined4 *)
                                              (&stack0xffffffffffffff48 +
                                              (long)(int)(uint)(local_c8 != 0) * 4) & 0x1f)));
              local_e0 = *(long *)(local_8[0x84f6] + 0x28 + (long)local_c8 * 8) +
                         (long)(iVar11 * (local_1c <<
                                         (2U - (char)*(undefined4 *)
                                                      (&stack0xffffffffffffff40 +
                                                      (long)(int)(uint)(local_c8 != 0) * 4) & 0x1f))
                               + (local_20 <<
                                 (2U - (char)*(undefined4 *)
                                              (&stack0xffffffffffffff48 +
                                              (long)(int)(uint)(local_c8 != 0) * 4) & 0x1f)));
              for (local_e8 = 0;
                  local_e8 <
                  (int)(uint)bVar2 >>
                  ((byte)*(undefined4 *)
                          (&stack0xffffffffffffff40 + (long)(int)(uint)(local_c8 != 0) * 4) & 0x1f);
                  local_e8 = local_e8 + 1) {
                for (local_ec = 0;
                    local_ec <
                    (int)(uint)bVar1 >>
                    ((byte)*(undefined4 *)
                            (&stack0xffffffffffffff48 + (long)(int)(uint)(local_c8 != 0) * 4) & 0x1f
                    ); local_ec = local_ec + 1) {
                  *(char *)(local_d0 + local_ec) =
                       (char)((int)((uint)*(byte *)(local_e0 + local_ec) +
                                   (uint)*(byte *)(local_d0 + local_ec)) >> 1);
                }
                local_d0 = local_d0 + iVar10;
                local_e0 = local_e0 + iVar11;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_source_content_sb(AV1_COMP *cpi, MACROBLOCK *x, TileDataEnc *tile_data,
                           int mi_row, int mi_col) {
  if (cpi->last_source->y_width != cpi->source->y_width ||
      cpi->last_source->y_height != cpi->source->y_height)
    return;
#if CONFIG_AV1_HIGHBITDEPTH
  if (x->e_mbd.cur_buf->flags & YV12_FLAG_HIGHBITDEPTH) return;
#endif

  unsigned int tmp_sse;
  unsigned int tmp_variance;
  const BLOCK_SIZE bsize = cpi->common.seq_params->sb_size;
  uint8_t *src_y = cpi->source->y_buffer;
  const int src_ystride = cpi->source->y_stride;
  const int src_offset = src_ystride * (mi_row << 2) + (mi_col << 2);
  uint8_t *last_src_y = cpi->last_source->y_buffer;
  const int last_src_ystride = cpi->last_source->y_stride;
  const int last_src_offset = last_src_ystride * (mi_row << 2) + (mi_col << 2);
  uint64_t avg_source_sse_threshold_verylow = 10000;     // ~1.5*1.5*(64*64)
  uint64_t avg_source_sse_threshold_low[2] = { 100000,   // ~5*5*(64*64)
                                               36000 };  // ~3*3*(64*64)

  uint64_t avg_source_sse_threshold_high = 1000000;  // ~15*15*(64*64)
  if (cpi->sf.rt_sf.increase_source_sad_thresh) {
    avg_source_sse_threshold_high = avg_source_sse_threshold_high << 1;
    avg_source_sse_threshold_low[0] = avg_source_sse_threshold_low[0] << 1;
    avg_source_sse_threshold_verylow = avg_source_sse_threshold_verylow << 1;
  }
  uint64_t sum_sq_thresh = 10000;  // sum = sqrt(thresh / 64*64)) ~1.5
  src_y += src_offset;
  last_src_y += last_src_offset;
  tmp_variance = cpi->ppi->fn_ptr[bsize].vf(src_y, src_ystride, last_src_y,
                                            last_src_ystride, &tmp_sse);
  // rd thresholds
  if (tmp_sse < avg_source_sse_threshold_low[1])
    x->content_state_sb.source_sad_rd = kLowSad;

  // nonrd thresholds
  if (tmp_sse == 0) {
    x->content_state_sb.source_sad_nonrd = kZeroSad;
    return;
  }
  if (tmp_sse < avg_source_sse_threshold_verylow)
    x->content_state_sb.source_sad_nonrd = kVeryLowSad;
  else if (tmp_sse < avg_source_sse_threshold_low[0])
    x->content_state_sb.source_sad_nonrd = kLowSad;
  else if (tmp_sse > avg_source_sse_threshold_high)
    x->content_state_sb.source_sad_nonrd = kHighSad;

  // Detect large lighting change.
  // Note: tmp_sse - tmp_variance = ((sum * sum) >> 12)
  if (tmp_variance < (tmp_sse >> 1) && (tmp_sse - tmp_variance) > sum_sq_thresh)
    x->content_state_sb.lighting_change = 1;
  if ((tmp_sse - tmp_variance) < (sum_sq_thresh >> 1))
    x->content_state_sb.low_sumdiff = 1;

  if (tmp_sse > ((avg_source_sse_threshold_high * 7) >> 3) &&
      !x->content_state_sb.lighting_change && !x->content_state_sb.low_sumdiff)
    x->sb_force_fixed_part = 0;

  if (!cpi->sf.rt_sf.use_rtc_tf || cpi->rc.high_source_sad ||
      cpi->rc.frame_source_sad > 20000 || cpi->svc.number_spatial_layers > 1)
    return;

  // In-place temporal filter. If psnr calculation is enabled, we store the
  // source for that.
  AV1_COMMON *const cm = &cpi->common;
  // Calculate n*mean^2
  const unsigned int nmean2 = tmp_sse - tmp_variance;
  const int ac_q_step = av1_ac_quant_QTX(cm->quant_params.base_qindex, 0,
                                         cm->seq_params->bit_depth);
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const int avg_q_step = av1_ac_quant_QTX(p_rc->avg_frame_qindex[INTER_FRAME],
                                          0, cm->seq_params->bit_depth);

  const unsigned int threshold =
      (cpi->sf.rt_sf.use_rtc_tf == 1)
          ? (clamp(avg_q_step, 250, 1000)) * ac_q_step
          : 250 * ac_q_step;

  // TODO(yunqing): use a weighted sum instead of averaging in filtering.
  if (tmp_variance <= threshold && nmean2 <= 15) {
    // Check neighbor blocks. If neighbor blocks aren't low-motion blocks,
    // skip temporal filtering for this block.
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    const TileInfo *const tile_info = &tile_data->tile_info;
    const int is_neighbor_blocks_low_motion = check_neighbor_blocks(
        mi, cm->mi_params.mi_stride, tile_info, mi_row, mi_col);
    if (!is_neighbor_blocks_low_motion) return;

    // Only consider 64x64 SB for now. Need to extend to 128x128 for large SB
    // size.
    // Test several nearby points. If non-zero mv exists, don't do temporal
    // filtering.
    const int is_this_blk_low_motion = fast_detect_non_zero_motion(
        cpi, src_y, src_ystride, last_src_y, last_src_ystride, mi_row, mi_col);

    if (!is_this_blk_low_motion) return;

    const int shift_x[2] = { 0, cpi->source->subsampling_x };
    const int shift_y[2] = { 0, cpi->source->subsampling_y };
    const uint8_t h = block_size_high[bsize];
    const uint8_t w = block_size_wide[bsize];

    for (int plane = 0; plane < av1_num_planes(cm); ++plane) {
      uint8_t *src = cpi->source->buffers[plane];
      const int src_stride = cpi->source->strides[plane != 0];
      uint8_t *last_src = cpi->last_source->buffers[plane];
      const int last_src_stride = cpi->last_source->strides[plane != 0];
      src += src_stride * (mi_row << (2 - shift_y[plane != 0])) +
             (mi_col << (2 - shift_x[plane != 0]));
      last_src += last_src_stride * (mi_row << (2 - shift_y[plane != 0])) +
                  (mi_col << (2 - shift_x[plane != 0]));

      for (int i = 0; i < (h >> shift_y[plane != 0]); ++i) {
        for (int j = 0; j < (w >> shift_x[plane != 0]); ++j) {
          src[j] = (last_src[j] + src[j]) >> 1;
        }
        src += src_stride;
        last_src += last_src_stride;
      }
    }
  }
}